

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfEnvmap.cpp
# Opt level: O1

V2f __thiscall Imf_2_5::LatLongMap::latLong(LatLongMap *this,V3f *dir)

{
  float fVar1;
  V2f VVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float extraout_XMM0_Db;
  
  fVar4 = dir->z * dir->z + dir->x * dir->x;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar1 = dir->y;
  fVar5 = dir->z * dir->z + dir->x * dir->x + fVar1 * fVar1;
  if (ABS(fVar1) <= fVar4) {
    if (2.3509887e-38 <= fVar5) {
      if (fVar5 < 0.0) {
        fVar5 = sqrtf(fVar5);
      }
      else {
        fVar5 = SQRT(fVar5);
      }
    }
    else {
      fVar5 = Imath_2_5::Vec3<float>::lengthTiny(dir);
    }
    fVar4 = asinf(fVar1 / fVar5);
  }
  else {
    if (2.3509887e-38 <= fVar5) {
      if (fVar5 < 0.0) {
        fVar5 = sqrtf(fVar5);
      }
      else {
        fVar5 = SQRT(fVar5);
      }
    }
    else {
      fVar5 = Imath_2_5::Vec3<float>::lengthTiny(dir);
    }
    fVar4 = acosf(fVar4 / fVar5);
    uVar3 = -(uint)(0.0 < dir->y);
    fVar4 = (float)(uVar3 & 0x3f800000 | ~uVar3 & -(uint)(dir->y < 0.0) & 0xbf800000) * fVar4;
  }
  fVar1 = dir->x;
  fVar5 = dir->z;
  fVar6 = 0.0;
  fVar7 = 0.0;
  if ((((fVar5 != 0.0) || (NAN(fVar5))) || (fVar1 != 0.0)) || (NAN(fVar1))) {
    fVar6 = atan2f(fVar1,fVar5);
    fVar7 = extraout_XMM0_Db;
  }
  *(float *)this = fVar4;
  *(float *)(this + 4) = fVar6;
  VVar2.y = fVar7;
  VVar2.x = fVar6;
  return VVar2;
}

Assistant:

V2f	
latLong (const V3f &dir)
{
    float r = sqrt (dir.z * dir.z + dir.x * dir.x);

    float latitude = (r < abs (dir.y))?
			 acos (r / dir.length()) * sign (dir.y):
			 asin (dir.y / dir.length());

    float longitude = (dir.z == 0 && dir.x == 0)? 0: atan2 (dir.x, dir.z);

    return V2f (latitude, longitude);
}